

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_BigFourWinds_TestShell::
TEST_DoublingFactorCounterTest_BigFourWinds_TestShell
          (TEST_DoublingFactorCounterTest_BigFourWinds_TestShell *this)

{
  TEST_DoublingFactorCounterTest_BigFourWinds_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_DoublingFactorCounterTest_BigFourWinds_TestShell_00256d90;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, BigFourWinds)
{
	addPair(Tile::OneOfBamboos);
	addTriplet(Tile::EastWind, false);
	addTriplet(Tile::SouthWind, false);
	addTriplet(Tile::WestWind, false);
	addTriplet(Tile::NorthWind, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::BigFourWinds));
	CHECK_EQUAL(100, r.doubling_factor);
}